

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteStates::MADPComponentDiscreteStates
          (MADPComponentDiscreteStates *this,MADPComponentDiscreteStates *a)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  vector<StateDiscrete,_std::allocator<StateDiscrete>_> *in_stack_00000068;
  vector<StateDiscrete,_std::allocator<StateDiscrete>_> *in_stack_00000070;
  StateDistributionVector *a_00;
  StateDistributionVector *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__MADPComponentDiscreteStates_00d3fad8;
  a_00 = (StateDistributionVector *)(in_RDI + 3);
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::vector
            ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)0xad5df4);
  *(byte *)(in_RDI + 1) = *(byte *)(in_RSI + 8) & 1;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::operator=
            (in_stack_00000070,in_stack_00000068);
  pvVar1 = operator_new(0x20);
  StateDistributionVector::StateDistributionVector(in_stack_ffffffffffffffe0,a_00);
  in_RDI[6] = pvVar1;
  return;
}

Assistant:

MADPComponentDiscreteStates::MADPComponentDiscreteStates(
    const MADPComponentDiscreteStates& a)
{
    _m_initialized=a._m_initialized;
    _m_nrStates=a._m_nrStates;
    _m_stateVec=a._m_stateVec;
    _m_initialStateDistribution=
        new StateDistributionVector(*a._m_initialStateDistribution);
}